

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_11f98de::AV1ResolutionChange_InvalidInputSize_Test::TestBody
          (AV1ResolutionChange_InvalidInputSize_Test *this)

{
  aom_codec_err_t aVar1;
  aom_codec_iface_t *iface;
  aom_codec_cx_pkt_t *lhs;
  long lVar2;
  int iVar3;
  aom_image_t *img;
  long *plVar4;
  SEARCH_METHODS *pSVar5;
  int iVar6;
  aom_codec_iter_t iter;
  AssertHelper local_468;
  AssertionResult gtest_ar_3;
  AssertHelper local_450;
  unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> enc;
  int frame_count;
  long local_430;
  RandomVideoSource video;
  aom_codec_ctx_t ctx;
  aom_codec_enc_cfg_t cfg;
  
  iface = aom_codec_av1_cx();
  video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource._0_4_ =
       aom_codec_enc_config_default(iface,&cfg,(this->super_AV1ResolutionChange).usage_);
  enc._M_t.super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>._M_t.
  super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
  super__Tuple_impl<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
  super__Head_base<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*),_false>._M_head_impl =
       (_Head_base<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*),_false>)
       ((ulong)enc._M_t.super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
               _M_t.super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
               super__Tuple_impl<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
               super__Head_base<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*),_false>._M_head_impl._4_4_
       << 0x20);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&ctx,"aom_codec_enc_config_default(iface, &cfg, usage_)","AOM_CODEC_OK",
             (aom_codec_err_t *)&video,(aom_codec_err_t *)&enc);
  if ((char)ctx.name == '\0') {
    testing::Message::Message((Message *)&video);
    if (ctx.iface == (aom_codec_iface_t *)0x0) {
      pSVar5 = "";
    }
    else {
      pSVar5 = (SEARCH_METHODS *)(ctx.iface)->name;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&enc,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
               ,0xfc,(char *)pSVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&enc,(Message *)&video);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&enc);
    if ((long *)CONCAT44(video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource._4_4_,
                         (aom_codec_err_t)
                         video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(video.super_DummyVideoSource.super_VideoSource.
                                     _vptr_VideoSource._4_4_,
                                     (aom_codec_err_t)
                                     video.super_DummyVideoSource.super_VideoSource.
                                     _vptr_VideoSource) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ctx.iface);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ctx.iface);
    cfg.g_pass = AOM_RC_ONE_PASS;
    cfg.g_lag_in_frames = 0;
    cfg.rc_end_usage = (this->super_AV1ResolutionChange).rc_mode_;
    aVar1 = aom_codec_enc_init_ver(&ctx,iface,&cfg,0,0x1d);
    enc._M_t.super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>._M_t.
    super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
    super__Tuple_impl<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
    super__Head_base<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*),_false>._M_head_impl._0_4_ = aVar1;
    gtest_ar_3.success_ = false;
    gtest_ar_3._1_3_ = 0;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&video,
               "aom_codec_enc_init_ver(&ctx, iface, &cfg, 0, (10 + (7 + (9)) + 3))","AOM_CODEC_OK",
               (aom_codec_err_t *)&enc,(aom_codec_err_t *)&gtest_ar_3);
    if ((char)video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource == '\0') {
      testing::Message::Message((Message *)&enc);
      if (video.super_DummyVideoSource.img_ == (aom_image_t *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)video.super_DummyVideoSource.img_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                 ,0x104,(char *)pSVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&enc);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
      if (enc._M_t.super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>._M_t.
          super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
          super__Tuple_impl<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
          super__Head_base<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*),_false>._M_head_impl !=
          (_func_aom_codec_err_t_aom_codec_ctx_ptr *)0x0) {
        (**(code **)(*(long *)enc._M_t.
                              super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>
                              ._M_t.
                              super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>
                              .super__Tuple_impl<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
                              super__Head_base<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*),_false>.
                              _M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&video.super_DummyVideoSource.img_);
    enc._M_t.super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>._M_t.
    super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
    super__Tuple_impl<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
    super__Head_base<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*),_false>._M_head_impl =
         (_Head_base<1UL,_aom_codec_err_t_(*)(aom_codec_ctx_*),_false>)aom_codec_destroy;
    enc._M_t.super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>._M_t.
    super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>.
    super__Head_base<0UL,_aom_codec_ctx_*,_false>._M_head_impl = &ctx;
    gtest_ar_3._0_4_ =
         aom_codec_control(&ctx,0xd,(ulong)(uint)(this->super_AV1ResolutionChange).cpu_used_);
    iter = (aom_codec_iter_t)((ulong)iter._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&video,"aom_codec_control(enc.get(), AOME_SET_CPUUSED, cpu_used_)",
               "AOM_CODEC_OK",(aom_codec_err_t *)&gtest_ar_3,(aom_codec_err_t *)&iter);
    if ((char)video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource == '\0') {
      testing::Message::Message((Message *)&gtest_ar_3);
      if (video.super_DummyVideoSource.img_ == (aom_image_t *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)video.super_DummyVideoSource.img_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&iter,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                 ,0x108,(char *)pSVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&iter,(Message *)&gtest_ar_3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter);
      if ((long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&video.super_DummyVideoSource.img_);
    frame_count = 0;
    libaom_test::RandomVideoSource::RandomVideoSource(&video,0xbaba);
    video.super_DummyVideoSource.frame_ = 0;
    video.super_DummyVideoSource._44_4_ = video.seed_;
    (**(code **)(CONCAT44(video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource._4_4_,
                          (aom_codec_err_t)
                          video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource) + 0x50))
              ();
    iVar6 = 0;
    lVar2 = 0;
    while (lVar2 != 0x18) {
      cfg.g_w = *(uint *)((long)&TestBody::kFrameSizes._M_elems[0].width + lVar2);
      cfg.g_h = *(uint *)((long)&TestBody::kFrameSizes._M_elems[0].height + lVar2);
      local_430 = lVar2;
      if (cfg.g_h - 0x10001 < 0xffff0000 || cfg.g_w - 0x10001 < 0xffff0000) {
        aVar1 = aom_codec_enc_config_set
                          (enc._M_t.
                           super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>
                           ._M_t.
                           super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>
                           .super__Head_base<0UL,_aom_codec_ctx_*,_false>._M_head_impl,&cfg);
        iter = (aom_codec_iter_t)CONCAT44(iter._4_4_,aVar1);
        local_468.data_._0_4_ = AOM_CODEC_INVALID_PARAM;
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&gtest_ar_3,"aom_codec_enc_config_set(enc.get(), &cfg)",
                   "AOM_CODEC_INVALID_PARAM",(aom_codec_err_t *)&iter,(aom_codec_err_t *)&local_468)
        ;
        if (gtest_ar_3.success_ == false) {
          testing::Message::Message((Message *)&iter);
          pSVar5 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_3.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar5 = *(SEARCH_METHODS **)
                      gtest_ar_3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                     ,0x113,(char *)pSVar5);
          testing::internal::AssertHelper::operator=(&local_468,(Message *)&iter);
          testing::internal::AssertHelper::~AssertHelper(&local_468);
          if (iter != (aom_codec_iter_t)0x0) {
            (**(code **)(*iter + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_3.message_);
      }
      else {
        aVar1 = aom_codec_enc_config_set
                          (enc._M_t.
                           super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>
                           ._M_t.
                           super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>
                           .super__Head_base<0UL,_aom_codec_ctx_*,_false>._M_head_impl,&cfg);
        iter = (aom_codec_iter_t)CONCAT44(iter._4_4_,aVar1);
        local_468.data_._0_4_ = AOM_CODEC_OK;
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&gtest_ar_3,"aom_codec_enc_config_set(enc.get(), &cfg)",
                   "AOM_CODEC_OK",(aom_codec_err_t *)&iter,(aom_codec_err_t *)&local_468);
        if (gtest_ar_3.success_ == false) {
          testing::Message::Message((Message *)&iter);
          pSVar5 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_3.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar5 = *(SEARCH_METHODS **)
                      gtest_ar_3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                     ,0x117,(char *)pSVar5);
          testing::internal::AssertHelper::operator=(&local_468,(Message *)&iter);
          testing::internal::AssertHelper::~AssertHelper(&local_468);
          if (iter != (aom_codec_iter_t)0x0) {
            (**(code **)(*iter + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_3.message_);
        libaom_test::DummyVideoSource::SetSize(&video.super_DummyVideoSource,cfg.g_w,cfg.g_h);
        for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
          video.super_DummyVideoSource.frame_ = video.super_DummyVideoSource.frame_ + 1;
          (**(code **)(CONCAT44(video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource.
                                _4_4_,(aom_codec_err_t)
                                      video.super_DummyVideoSource.super_VideoSource.
                                      _vptr_VideoSource) + 0x50))(&video);
          img = (aom_image_t *)0x0;
          if (video.super_DummyVideoSource.frame_ < video.super_DummyVideoSource.limit_) {
            img = video.super_DummyVideoSource.img_;
          }
          local_468.data_._0_4_ =
               aom_codec_encode(enc._M_t.
                                super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>
                                ._M_t.
                                super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>
                                .super__Head_base<0UL,_aom_codec_ctx_*,_false>._M_head_impl,img,
                                (ulong)video.super_DummyVideoSource.frame_,1,0);
          local_450.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                    ((internal *)&gtest_ar_3,
                     "aom_codec_encode(enc.get(), video.img(), video.pts(), video.duration(), 0)",
                     "AOM_CODEC_OK",(aom_codec_err_t *)&local_468,(aom_codec_err_t *)&local_450);
          if (gtest_ar_3.success_ == false) {
            testing::Message::Message((Message *)&local_468);
            pSVar5 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pSVar5 = *(SEARCH_METHODS **)
                        gtest_ar_3.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_450,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                       ,0x121,(char *)pSVar5);
            testing::internal::AssertHelper::operator=(&local_450,(Message *)&local_468);
            testing::internal::AssertHelper::~AssertHelper(&local_450);
            if ((long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) !=
                (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_)
                          + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_3.message_);
          iter = (aom_codec_iter_t)0x0;
          while (lhs = aom_codec_get_cx_data
                                 (enc._M_t.
                                  super___uniq_ptr_impl<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_aom_codec_ctx_*,_aom_codec_err_t_(*)(aom_codec_ctx_*)>
                                  .super__Head_base<0UL,_aom_codec_ctx_*,_false>._M_head_impl,&iter)
                , lhs != (aom_codec_cx_pkt_t *)0x0) {
            local_468.data_._0_4_ = AOM_CODEC_OK;
            testing::internal::CmpHelperEQ<aom_codec_cx_pkt_kind,aom_codec_cx_pkt_kind>
                      ((internal *)&gtest_ar_3,"pkt->kind","AOM_CODEC_CX_FRAME_PKT",&lhs->kind,
                       (aom_codec_cx_pkt_kind *)&local_468);
            if (gtest_ar_3.success_ == false) {
              testing::Message::Message((Message *)&local_468);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar5 = "";
              }
              else {
                pSVar5 = *(SEARCH_METHODS **)
                          gtest_ar_3.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_450,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                         ,0x125,(char *)pSVar5);
              testing::internal::AssertHelper::operator=(&local_450,(Message *)&local_468);
              testing::internal::AssertHelper::~AssertHelper(&local_450);
              plVar4 = (long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_);
              goto LAB_005d5664;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_3.message_);
            if ((iVar3 == 0) || ((this->super_AV1ResolutionChange).usage_ == 2)) {
              local_468.data_._0_4_ = (lhs->data).frame.flags & AOM_CODEC_ERROR;
              local_450.data_._0_4_ = 0;
              testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                        ((internal *)&gtest_ar_3,"pkt->data.frame.flags & 0x1u","0u",
                         (uint *)&local_468,(uint *)&local_450);
              if (gtest_ar_3.success_ == false) {
                testing::Message::Message((Message *)&local_468);
                std::operator<<((ostream *)
                                (CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) +
                                0x10),"frame ");
                std::ostream::operator<<
                          ((void *)(CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_)
                                   + 0x10),iVar6);
                pSVar5 = "";
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl !=
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pSVar5 = *(SEARCH_METHODS **)
                            gtest_ar_3.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_450,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                           ,0x129,(char *)pSVar5);
                testing::internal::AssertHelper::operator=(&local_450,(Message *)&local_468);
                testing::internal::AssertHelper::~AssertHelper(&local_450);
                if ((long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) !=
                    (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_468.data_._4_4_,
                                                 (aom_codec_err_t)local_468.data_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_3.message_);
            }
            iVar6 = iVar6 + 1;
            frame_count = iVar6;
          }
        }
      }
      lVar2 = local_430 + 8;
    }
    iter = (aom_codec_iter_t)CONCAT44(iter._4_4_,2);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_3,"frame_count","2",&frame_count,(int *)&iter);
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&iter);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_468,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                 ,0x131,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_468,(Message *)&iter);
      testing::internal::AssertHelper::~AssertHelper(&local_468);
      plVar4 = (long *)iter;
LAB_005d5664:
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_3.message_);
    libaom_test::DummyVideoSource::~DummyVideoSource(&video.super_DummyVideoSource);
    std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::~unique_ptr(&enc);
  }
  return;
}

Assistant:

TEST_P(AV1ResolutionChange, InvalidInputSize) {
  struct FrameSize {
    unsigned int width;
    unsigned int height;
  };
  static constexpr std::array<FrameSize, 3> kFrameSizes = { {
      { 1768, 0 },
      { 0, 200 },
      { 850, 200 },
  } };

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, usage_), AOM_CODEC_OK);

  // Resolution changes are only permitted with one pass encoding with no lag.
  cfg.g_pass = AOM_RC_ONE_PASS;
  cfg.g_lag_in_frames = 0;
  cfg.rc_end_usage = rc_mode_;

  aom_codec_ctx_t ctx;
  EXPECT_EQ(aom_codec_enc_init(&ctx, iface, &cfg, 0), AOM_CODEC_OK);
  std::unique_ptr<aom_codec_ctx_t, decltype(&aom_codec_destroy)> enc(
      &ctx, &aom_codec_destroy);
  EXPECT_EQ(aom_codec_control(enc.get(), AOME_SET_CPUUSED, cpu_used_),
            AOM_CODEC_OK);

  int frame_count = 0;
  ::libaom_test::RandomVideoSource video;
  video.Begin();
  constexpr int kNumFramesPerResolution = 2;
  for (const auto &frame_size : kFrameSizes) {
    cfg.g_w = frame_size.width;
    cfg.g_h = frame_size.height;
    if (cfg.g_w < 1 || cfg.g_w > 65536 || cfg.g_h < 1 || cfg.g_h > 65536) {
      EXPECT_EQ(aom_codec_enc_config_set(enc.get(), &cfg),
                AOM_CODEC_INVALID_PARAM);
      continue;
    }

    EXPECT_EQ(aom_codec_enc_config_set(enc.get(), &cfg), AOM_CODEC_OK);
    video.SetSize(cfg.g_w, cfg.g_h);

    aom_codec_iter_t iter;
    const aom_codec_cx_pkt_t *pkt;

    for (int i = 0; i < kNumFramesPerResolution; ++i) {
      video.Next();  // SetSize() does not call FillFrame().
      EXPECT_EQ(aom_codec_encode(enc.get(), video.img(), video.pts(),
                                 video.duration(), /*flags=*/0),
                AOM_CODEC_OK);

      iter = nullptr;
      while ((pkt = aom_codec_get_cx_data(enc.get(), &iter)) != nullptr) {
        ASSERT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
        // The frame following a resolution change should be a keyframe as the
        // change is too extreme to allow previous references to be used.
        if (i == 0 || usage_ == AOM_USAGE_ALL_INTRA) {
          EXPECT_NE(pkt->data.frame.flags & AOM_FRAME_IS_KEY, 0u)
              << "frame " << frame_count;
        }
        frame_count++;
      }
    }
  }

  EXPECT_EQ(frame_count, 2);
}